

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O3

void __thiscall
QNetworkManagerInterface::QNetworkManagerInterface(QNetworkManagerInterface *this,QObject *parent)

{
  QVariant *this_00;
  undefined8 uVar1;
  char cVar2;
  QNetworkManagerInterface QVar3;
  int iVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QDBusPendingReply<QMap<QString,_QVariant>_> propsReply;
  QDBusError error;
  QArrayData *local_138;
  QArrayData *pQStack_130;
  qsizetype local_128;
  QString local_118;
  undefined1 local_f8 [8];
  char16_t *local_f0;
  QString local_e8;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  QArrayDataPointer<QVariant> local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  QArrayData *pQStack_70;
  qsizetype local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkManagerInterfaceBase::QNetworkManagerInterfaceBase
            ((QNetworkManagerInterfaceBase *)this,parent);
  *(undefined ***)this = &PTR_metaObject_00111658;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x20] = (QNetworkManagerInterface)0x1;
  cVar2 = QDBusAbstractInterface::isValid();
  if (cVar2 != '\0') {
    local_88._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QVar5.m_data = (storage_type *)0x1e;
    QVar5.m_size = (qsizetype)(local_88 + 0x10);
    QString::fromLatin1(QVar5);
    local_a8.d = (Data *)local_78;
    local_a8.ptr = (QVariant *)pQStack_70;
    local_a8.size = local_68;
    QVar6.m_data = (storage_type *)0x1f;
    QVar6.m_size = (qsizetype)(local_88 + 0x10);
    QString::fromLatin1(QVar6);
    local_c8.shared = (PrivateShared *)local_78;
    local_c8._8_8_ = pQStack_70;
    local_c8._16_8_ = local_68;
    QVar7.m_data = (storage_type *)0x1f;
    QVar7.m_size = (qsizetype)(local_88 + 0x10);
    QString::fromLatin1(QVar7);
    local_e8.d.d = (Data *)local_78;
    local_e8.d.ptr = (char16_t *)pQStack_70;
    local_e8.d.size = local_68;
    QDBusConnection::systemBus();
    PropertiesDBusInterface::PropertiesDBusInterface
              ((PropertiesDBusInterface *)local_88,(QString *)&local_a8,(QString *)&local_c8,
               &local_e8,(QDBusConnection *)(local_88 + 0x10),(QObject *)0x0);
    QDBusConnection::~QDBusConnection((QDBusConnection *)(local_88 + 0x10));
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
      UNLOCK();
      if (*(int *)local_c8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.shared,2,0x10);
      }
    }
    if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d)->super_QArrayData,2,0x10);
      }
    }
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (QVariant *)0x0;
    local_a8.size = 0;
    this_00 = (QVariant *)(local_88 + 0x10);
    QVar13.m_data = "org.freedesktop.NetworkManager";
    QVar13.m_size = 0x1e;
    QVariant::QVariant(this_00,QVar13);
    QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
              ((QMovableArrayOps<QVariant> *)&local_a8,local_a8.size,this_00);
    QList<QVariant>::end((QList<QVariant> *)&local_a8);
    QVariant::~QVariant(this_00);
    local_f0 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QVar8.m_data = (storage_type *)0x6;
    QVar8.m_size = (qsizetype)(local_88 + 0x10);
    QString::fromLatin1(QVar8);
    local_c8.shared = (PrivateShared *)local_78;
    local_c8._8_8_ = pQStack_70;
    local_c8._16_8_ = local_68;
    QDBusAbstractInterface::callWithArgumentList
              ((CallMode)&local_e8,(QString *)local_88,(QList *)0x1);
    QDBusPendingReplyBase::QDBusPendingReplyBase((QDBusPendingReplyBase *)&local_f0);
    QDBusPendingReplyBase::assign((QDBusMessage *)&local_f0);
    if (local_f0 != (char16_t *)0x0) {
      local_78 = (undefined1  [8])
                 &QtPrivate::QMetaTypeInterfaceWrapper<QMap<QString,QVariant>>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)&local_f0,(QMetaType *)0x1);
    }
    QDBusMessage::~QDBusMessage((QDBusMessage *)&local_e8);
    if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
      UNLOCK();
      if (*(int *)local_c8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.shared,2,0x10);
      }
    }
    cVar2 = QDBusPendingCall::isError();
    if (cVar2 == '\0') {
      QDBusPendingReplyBase::argumentAt((int)(QVariant *)(local_88 + 0x10));
      qdbus_cast<QMap<QString,QVariant>>((QVariant *)&local_c8);
      QVariant::~QVariant((QVariant *)(local_88 + 0x10));
      uVar1 = local_c8.shared;
      local_c8.shared = (PrivateShared *)0x0;
      local_78 = *(undefined1 (*) [8])(this + 0x10);
      *(undefined8 *)(this + 0x10) = uVar1;
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)(local_88 + 0x10));
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)&local_c8.shared);
      QDBusConnection::systemBus();
      QVar9.m_data = (storage_type *)0x1e;
      QVar9.m_size = (qsizetype)(local_88 + 0x10);
      QString::fromLatin1(QVar9);
      local_c8.shared = (PrivateShared *)local_78;
      local_c8._8_8_ = pQStack_70;
      local_c8._16_8_ = local_68;
      QVar10.m_data = (storage_type *)0x1f;
      QVar10.m_size = (qsizetype)(local_88 + 0x10);
      QString::fromLatin1(QVar10);
      local_e8.d.d = (Data *)local_78;
      local_e8.d.ptr = (char16_t *)pQStack_70;
      local_e8.d.size = local_68;
      QVar11.m_data = (storage_type *)0x1f;
      QVar11.m_size = (qsizetype)(local_88 + 0x10);
      QString::fromLatin1(QVar11);
      local_118.d.d = (Data *)local_78;
      local_118.d.ptr = (char16_t *)pQStack_70;
      local_118.d.size = local_68;
      QVar12.m_data = (storage_type *)0x11;
      QVar12.m_size = (qsizetype)(local_88 + 0x10);
      QString::fromLatin1(QVar12);
      local_138 = (QArrayData *)local_78;
      pQStack_130 = pQStack_70;
      local_128 = local_68;
      QVar3 = (QNetworkManagerInterface)
              QDBusConnection::connect
                        ((QString *)local_f8,(QString *)&local_c8,&local_e8,&local_118,
                         (QObject *)&local_138,(char *)this);
      this[0x20] = QVar3;
      if (local_138 != (QArrayData *)0x0) {
        LOCK();
        (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_138->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_138,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
        UNLOCK();
        if (*(int *)local_c8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.shared,2,0x10);
        }
      }
      QDBusConnection::~QDBusConnection((QDBusConnection *)local_f8);
    }
    else {
      this[0x20] = (QNetworkManagerInterface)0x0;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      uStack_40 = 0xaaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
      uStack_50 = 0xaaaaaaaaaaaaaaaa;
      local_68 = -0x5555555555555556;
      uStack_60 = 0xaaaaaaaaaaaaaaaa;
      local_78 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
      pQStack_70 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
      QDBusPendingCall::error();
      iVar4 = QDBusError::type();
      if (iVar4 != 9) {
        QNetworkManagerInterface((QNetworkManagerInterface *)(local_88 + 0x10));
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      if (pQStack_70 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_70,2,0x10);
        }
      }
    }
    QDBusPendingReplyBase::~QDBusPendingReplyBase((QDBusPendingReplyBase *)&local_f0);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_a8);
    QDBusAbstractInterface::~QDBusAbstractInterface((QDBusAbstractInterface *)local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::QNetworkManagerInterface(QObject *parent)
    : QNetworkManagerInterfaceBase(parent)
{
    if (!QDBusAbstractInterface::isValid())
        return;

    PropertiesDBusInterface managerPropertiesInterface(
            NM_DBUS_SERVICE, NM_DBUS_PATH, DBUS_PROPERTIES_INTERFACE,
            QDBusConnection::systemBus());
    QList<QVariant> argumentList;
    argumentList << NM_DBUS_SERVICE;
    QDBusPendingReply<QVariantMap> propsReply = managerPropertiesInterface.callWithArgumentList(
            QDBus::Block, "GetAll"_L1, argumentList);
    if (propsReply.isError()) {
        validDBusConnection = false;
        if (auto error = propsReply.error(); error.type() != QDBusError::AccessDenied)
            qWarning() << "Failed to query NetworkManager properties:" << error.message();
        return;
    }
    propertyMap = propsReply.value();

    validDBusConnection = QDBusConnection::systemBus().connect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}